

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t gt_tval_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,int timeridx)

{
  int iVar1;
  uint uVar2;
  int64_t iVar4;
  CPUARMState_conflict *__mptr;
  uint64_t uVar3;
  
  if (((int)ri == 4) || ((int)ri == 1)) {
    uVar3 = gt_virt_cnt_offset(env);
    iVar1 = (int)uVar3;
  }
  else {
    iVar1 = 0;
  }
  uVar3 = (env->cp15).c14_timer[(ulong)ri & 0xffffffff].cval;
  iVar4 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  uVar2 = gt_cntfrq_period_ns_aarch64((ARMCPU_conflict *)(env[-4].vfp.zregs[0x17].d + 0x14));
  return (ulong)(uint)((iVar1 + (int)uVar3) - (int)(iVar4 / (long)(ulong)uVar2));
}

Assistant:

static uint64_t gt_tval_read(CPUARMState *env, const ARMCPRegInfo *ri,
                             int timeridx)
{
    uint64_t offset = 0;

    switch (timeridx) {
    case GTIMER_VIRT:
    case GTIMER_HYPVIRT:
        offset = gt_virt_cnt_offset(env);
        break;
    }

    return (uint32_t)(env->cp15.c14_timer[timeridx].cval -
                      (gt_get_countervalue(env) - offset));
}